

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::boxed_cast<chaiscript::Boxed_Value_const&>
          (chaiscript *this,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  type_info *ptVar3;
  type_info *ptVar4;
  bool bVar5;
  undefined8 *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Boxed_Value BVar8;
  undefined1 local_68 [16];
  uint local_58;
  undefined4 uStack_54;
  pointer_____offset_0x10___ *local_38;
  pointer_____offset_0x10___ *local_30;
  _Rb_tree_color local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_conversions;
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_68._0_8_ = &Boxed_Value::typeinfo;
    local_68._8_8_ = &Boxed_Value::typeinfo;
    local_58 = 3;
    bVar5 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_68);
    _Var7._M_pi = extraout_RDX;
    if (!bVar5) {
      bVar5 = Type_Conversions::convertable_type<chaiscript::Boxed_Value_const&>
                        ((t_conversions->m_conversions)._M_data);
      _Var7._M_pi = extraout_RDX_00;
      if (bVar5) {
        bVar5 = Type_Conversions::convertable_type<chaiscript::Boxed_Value_const&>
                          ((t_conversions->m_conversions)._M_data);
        if (!bVar5) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
          peVar2 = (bv->m_data).
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_58 = (peVar2->m_type_info).m_flags;
          uStack_54 = *(undefined4 *)&(peVar2->m_type_info).field_0x14;
          ptVar3 = (peVar2->m_type_info).m_type_info;
          ptVar4 = (peVar2->m_type_info).m_bare_type_info;
          *puVar6 = &PTR__bad_cast_00321588;
          local_68._0_4_ = SUB84(ptVar3,0);
          local_68._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
          local_68._8_4_ = SUB84(ptVar4,0);
          local_68._12_4_ = (undefined4)((ulong)ptVar4 >> 0x20);
          *(undefined4 *)(puVar6 + 1) = local_68._0_4_;
          *(undefined4 *)((long)puVar6 + 0xc) = local_68._4_4_;
          *(undefined4 *)(puVar6 + 2) = local_68._8_4_;
          *(undefined4 *)((long)puVar6 + 0x14) = local_68._12_4_;
          puVar6[3] = _local_58;
          puVar6[4] = &Boxed_Value::typeinfo;
          puVar6[5] = 0x19;
          puVar6[6] = "Cannot perform boxed_cast";
          local_68._0_8_ = ptVar3;
          local_68._8_8_ = ptVar4;
          __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        local_38 = &Boxed_Value::typeinfo;
        local_30 = &Boxed_Value::typeinfo;
        local_28 = 3;
        BVar8 = Type_Conversions::boxed_type_conversion
                          ((Type_Conversions *)local_68,
                           (Type_Info *)(t_conversions->m_conversions)._M_data,
                           (Conversion_Saves *)&local_38,
                           (Boxed_Value *)(t_conversions->m_saves)._M_data);
        _Var7._M_pi = BVar8.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        *(undefined8 *)this = local_68._0_8_;
        *(undefined8 *)(this + 8) = local_68._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_68._8_8_ + 8) = *(_Atomic_word *)(local_68._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_68._8_8_ + 8) = *(_Atomic_word *)(local_68._8_8_ + 8) + 1;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
          _Var7._M_pi = extraout_RDX_01;
        }
        goto LAB_00267efc;
      }
    }
  }
  *(element_type **)this =
       (bv->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var1 = (bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
LAB_00267efc:
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var7._M_pi;
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }